

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
InterpreterTest_OrI32_Test::~InterpreterTest_OrI32_Test(InterpreterTest_OrI32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(InterpreterTest, OrI32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(uint32_t(2))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(uint32_t(4))).getErr());
  ASSERT_FALSE(builder.makeBinary(OrInt32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(uint32_t(6))};

  EXPECT_EQ(results, expected);
}